

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gather.cpp
# Opt level: O0

void duckdb::GatherNestedVector
               (Vector *rows,SelectionVector *row_sel,Vector *col,SelectionVector *col_sel,
               idx_t count,RowLayout *layout,idx_t col_no,data_ptr_t base_heap_ptr)

{
  value_type vVar1;
  uchar *puVar2;
  long lVar3;
  const_reference pvVar4;
  idx_t iVar5;
  uchar **ppuVar6;
  idx_t iVar7;
  type ppuVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  uchar *puVar11;
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_> *in_RCX;
  SelectionVector *in_RSI;
  ulong in_R8;
  RowLayout *in_R9;
  long in_stack_00000010;
  NestedValidity parent_validity;
  data_ptr_t heap_row_ptr;
  uchar *heap_ptr_ptr;
  uchar *col_ptr;
  uchar *row;
  idx_t row_idx;
  idx_t i;
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false> mask_locations;
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false> data_locations;
  uchar **ptrs;
  idx_t heap_offset;
  value_type col_offset;
  vector<unsigned_long,_true> *offsets;
  data_ptr_t *in_stack_fffffffffffffec8;
  NestedValidity *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  optional_ptr<duckdb::NestedValidity,_true> local_d0 [2];
  data_ptr_t *in_stack_ffffffffffffff40;
  SelectionVector *in_stack_ffffffffffffff48;
  idx_t *in_stack_ffffffffffffff50;
  Vector *in_stack_ffffffffffffff58;
  optional_ptr<duckdb::NestedValidity,_true> in_stack_ffffffffffffff60;
  ulong local_78;
  
  RowLayout::GetOffsets(in_R9);
  pvVar4 = vector<unsigned_long,_true>::operator[]
                     ((vector<unsigned_long,_true> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
  vVar1 = *pvVar4;
  iVar5 = RowLayout::GetHeapOffset(in_R9);
  ppuVar6 = FlatVector::GetData<unsigned_char*>((Vector *)0x159380e);
  make_unsafe_uniq_array_uninitialized<unsigned_char*>(in_stack_fffffffffffffed8);
  make_unsafe_uniq_array_uninitialized<unsigned_char*>(in_stack_fffffffffffffed8);
  for (local_78 = 0; local_78 < in_R8; local_78 = local_78 + 1) {
    iVar7 = SelectionVector::get_index(in_RSI,local_78);
    puVar11 = ppuVar6[iVar7];
    ppuVar8 = unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false>::operator[]
                        ((unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false>
                          *)in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
    lVar3 = in_stack_00000010;
    *ppuVar8 = puVar11;
    puVar2 = ppuVar6[iVar7];
    if (in_stack_00000010 == 0) {
      puVar11 = Load<unsigned_char*>(puVar2 + vVar1);
      ppuVar8 = unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false>::
                operator[]((unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false>
                            *)in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
      *ppuVar8 = puVar11;
    }
    else {
      uVar9 = Load<unsigned_long>(puVar11 + iVar5);
      in_stack_ffffffffffffff60.ptr = (NestedValidity *)(lVar3 + uVar9);
      uVar10 = Load<unsigned_long>(puVar2 + vVar1);
      ppuVar8 = unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false>::
                operator[]((unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false>
                            *)in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
      *ppuVar8 = (uchar *)((long)&((NestedValidity *)(lVar3 + uVar9))->list_validity_location +
                          uVar10);
    }
  }
  ::std::unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>::get
            ((unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_> *)
             in_stack_fffffffffffffed0);
  NestedValidity::NestedValidity(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,0x1593a6e);
  ::std::unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>::get(in_RCX);
  optional_ptr<duckdb::NestedValidity,_true>::optional_ptr
            (local_d0,(NestedValidity *)(local_d0 + 1));
  RowOperations::HeapGather
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff60);
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false>::~unique_ptr
            ((unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false> *)0x1593adb
            );
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false>::~unique_ptr
            ((unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false> *)0x1593ae8
            );
  return;
}

Assistant:

static void GatherNestedVector(Vector &rows, const SelectionVector &row_sel, Vector &col,
                               const SelectionVector &col_sel, idx_t count, const RowLayout &layout, idx_t col_no,
                               data_ptr_t base_heap_ptr) {
	const auto &offsets = layout.GetOffsets();
	const auto col_offset = offsets[col_no];
	const auto heap_offset = layout.GetHeapOffset();
	auto ptrs = FlatVector::GetData<data_ptr_t>(rows);

	// Build the gather locations
	auto data_locations = make_unsafe_uniq_array_uninitialized<data_ptr_t>(count);
	auto mask_locations = make_unsafe_uniq_array_uninitialized<data_ptr_t>(count);
	for (idx_t i = 0; i < count; i++) {
		auto row_idx = row_sel.get_index(i);
		auto row = ptrs[row_idx];
		mask_locations[i] = row;
		auto col_ptr = ptrs[row_idx] + col_offset;
		if (base_heap_ptr) {
			auto heap_ptr_ptr = row + heap_offset;
			auto heap_row_ptr = base_heap_ptr + Load<idx_t>(heap_ptr_ptr);
			data_locations[i] = heap_row_ptr + Load<idx_t>(col_ptr);
		} else {
			data_locations[i] = Load<data_ptr_t>(col_ptr);
		}
	}

	// Deserialise into the selected locations
	NestedValidity parent_validity(mask_locations.get(), col_no);
	RowOperations::HeapGather(col, count, col_sel, data_locations.get(), &parent_validity);
}